

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  stdio_transporter local_58;
  transporter local_28;
  lscpp_message_handler local_1c;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_1c.shutdown_ = false;
  local_1c.initialized_ = false;
  local_1c.ready_ = false;
  local_18 = argv;
  argv_local._4_4_ = argc;
  lscpp::experimental::server_with_default_handler::server_with_default_handler
            ((server_with_default_handler *)&local_1c);
  lscpp::stdio_transporter::stdio_transporter(&local_58,false);
  lscpp::transporter::transporter<lscpp::stdio_transporter>(&local_28,&local_58);
  lscpp::experimental::launch<my_lsp_server::server>((server *)&local_1c,&local_28);
  lscpp::transporter::~transporter(&local_28);
  lscpp::stdio_transporter::~stdio_transporter(&local_58);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  lscpp::experimental::launch(my_lsp_server::server{},
                              lscpp::stdio_transporter{false});
}